

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_avx2.c
# Opt level: O0

void aom_filter_block1d16_h8_avx2
               (uint8_t *src_ptr,ptrdiff_t src_pixels_per_line,uint8_t *output_ptr,
               ptrdiff_t output_pitch,uint32_t output_height,int16_t *filter)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar26 [16];
  undefined1 (*pauVar22) [16];
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 (*in_R9) [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  __m128i srcRegFilt3;
  __m128i srcRegFilt2;
  __m128i srcRegFilt2_1;
  __m128i srcRegFilt1_1;
  __m128i srcReg2;
  __m128i srcReg1;
  __m256i sum23;
  ptrdiff_t dst_stride;
  ptrdiff_t src_stride;
  uint i;
  __m256i filtersReg32;
  __m256i srcReg32b2;
  __m256i srcReg32b1;
  __m256i srcRegFilt32b3;
  __m256i srcRegFilt32b2;
  __m256i srcRegFilt32b2_1;
  __m256i srcRegFilt32b1_1;
  __m256i forthFilters;
  __m256i thirdFilters;
  __m256i secondFilters;
  __m256i firstFilters;
  __m256i filt4Reg;
  __m256i filt3Reg;
  __m256i filt2Reg;
  __m256i filt1Reg;
  __m256i addFilterReg32;
  __m128i filtersReg;
  __m256i *in_stack_ffffffffffffed60;
  ptrdiff_t in_stack_ffffffffffffed68;
  undefined6 in_stack_ffffffffffffed70;
  undefined2 uVar27;
  undefined1 in_stack_ffffffffffffed80 [16];
  undefined8 local_1250;
  undefined8 uStack_1248;
  uint local_11e4;
  undefined8 *local_fa8;
  undefined1 (*local_f98) [16];
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 uStack_390;
  undefined8 uStack_388;
  
  auVar21 = filt_global_avx2._96_32_;
  local_f98 = (undefined1 (*) [16])(in_RDI + -3);
  uVar27 = 0x20;
  auVar1 = vpinsrw_avx(ZEXT216(0x20),0x20,1);
  auVar1 = vpinsrw_avx(auVar1,0x20,2);
  auVar1 = vpinsrw_avx(auVar1,0x20,3);
  auVar1 = vpinsrw_avx(auVar1,0x20,4);
  auVar1 = vpinsrw_avx(auVar1,0x20,5);
  auVar1 = vpinsrw_avx(auVar1,0x20,6);
  auVar1 = vpinsrw_avx(auVar1,0x20,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x20),0x20,1);
  auVar2 = vpinsrw_avx(auVar2,0x20,2);
  auVar2 = vpinsrw_avx(auVar2,0x20,3);
  auVar2 = vpinsrw_avx(auVar2,0x20,4);
  auVar2 = vpinsrw_avx(auVar2,0x20,5);
  auVar2 = vpinsrw_avx(auVar2,0x20,6);
  auVar2 = vpinsrw_avx(auVar2,0x20,7);
  uStack_490 = auVar2._0_8_;
  uStack_488 = auVar2._8_8_;
  auVar2 = vpsraw_avx(*in_R9,ZEXT416(1));
  vpacksswb_avx(auVar2,auVar2);
  auVar2 = vpinsrw_avx(ZEXT216(0x100),0x100,1);
  auVar2 = vpinsrw_avx(auVar2,0x100,2);
  auVar2 = vpinsrw_avx(auVar2,0x100,3);
  auVar2 = vpinsrw_avx(auVar2,0x100,4);
  auVar2 = vpinsrw_avx(auVar2,0x100,5);
  auVar2 = vpinsrw_avx(auVar2,0x100,6);
  auVar2 = vpinsrw_avx(auVar2,0x100,7);
  auVar3 = vpinsrw_avx(ZEXT216(0x100),0x100,1);
  auVar3 = vpinsrw_avx(auVar3,0x100,2);
  auVar3 = vpinsrw_avx(auVar3,0x100,3);
  auVar3 = vpinsrw_avx(auVar3,0x100,4);
  auVar3 = vpinsrw_avx(auVar3,0x100,5);
  auVar3 = vpinsrw_avx(auVar3,0x100,6);
  auVar3 = vpinsrw_avx(auVar3,0x100,7);
  uStack_450 = auVar3._0_8_;
  uStack_448 = auVar3._8_8_;
  auVar24._8_8_ = uStack_ed8;
  auVar24._0_8_ = local_ee0;
  auVar24._16_8_ = local_ee0;
  auVar24._24_8_ = uStack_ed8;
  auVar5._16_8_ = uStack_450;
  auVar5._0_16_ = auVar2;
  auVar5._24_8_ = uStack_448;
  auVar5 = vpshufb_avx2(auVar24,auVar5);
  auVar2 = vpinsrw_avx(ZEXT216(0x302),0x302,1);
  auVar2 = vpinsrw_avx(auVar2,0x302,2);
  auVar2 = vpinsrw_avx(auVar2,0x302,3);
  auVar2 = vpinsrw_avx(auVar2,0x302,4);
  auVar2 = vpinsrw_avx(auVar2,0x302,5);
  auVar2 = vpinsrw_avx(auVar2,0x302,6);
  auVar2 = vpinsrw_avx(auVar2,0x302,7);
  auVar3 = vpinsrw_avx(ZEXT216(0x302),0x302,1);
  auVar3 = vpinsrw_avx(auVar3,0x302,2);
  auVar3 = vpinsrw_avx(auVar3,0x302,3);
  auVar3 = vpinsrw_avx(auVar3,0x302,4);
  auVar3 = vpinsrw_avx(auVar3,0x302,5);
  auVar3 = vpinsrw_avx(auVar3,0x302,6);
  auVar3 = vpinsrw_avx(auVar3,0x302,7);
  uStack_410 = auVar3._0_8_;
  uStack_408 = auVar3._8_8_;
  auVar10._8_8_ = uStack_ed8;
  auVar10._0_8_ = local_ee0;
  auVar10._16_8_ = local_ee0;
  auVar10._24_8_ = uStack_ed8;
  auVar6._16_8_ = uStack_410;
  auVar6._0_16_ = auVar2;
  auVar6._24_8_ = uStack_408;
  auVar6 = vpshufb_avx2(auVar10,auVar6);
  auVar2 = vpinsrw_avx(ZEXT216(0x504),0x504,1);
  auVar2 = vpinsrw_avx(auVar2,0x504,2);
  auVar2 = vpinsrw_avx(auVar2,0x504,3);
  auVar2 = vpinsrw_avx(auVar2,0x504,4);
  auVar2 = vpinsrw_avx(auVar2,0x504,5);
  auVar2 = vpinsrw_avx(auVar2,0x504,6);
  auVar2 = vpinsrw_avx(auVar2,0x504,7);
  auVar3 = vpinsrw_avx(ZEXT216(0x504),0x504,1);
  auVar3 = vpinsrw_avx(auVar3,0x504,2);
  auVar3 = vpinsrw_avx(auVar3,0x504,3);
  auVar3 = vpinsrw_avx(auVar3,0x504,4);
  auVar3 = vpinsrw_avx(auVar3,0x504,5);
  auVar3 = vpinsrw_avx(auVar3,0x504,6);
  auVar3 = vpinsrw_avx(auVar3,0x504,7);
  uStack_3d0 = auVar3._0_8_;
  uStack_3c8 = auVar3._8_8_;
  auVar9._8_8_ = uStack_ed8;
  auVar9._0_8_ = local_ee0;
  auVar9._16_8_ = local_ee0;
  auVar9._24_8_ = uStack_ed8;
  auVar7._16_8_ = uStack_3d0;
  auVar7._0_16_ = auVar2;
  auVar7._24_8_ = uStack_3c8;
  auVar7 = vpshufb_avx2(auVar9,auVar7);
  auVar2 = vpinsrw_avx(ZEXT216(0x706),0x706,1);
  auVar2 = vpinsrw_avx(auVar2,0x706,2);
  auVar2 = vpinsrw_avx(auVar2,0x706,3);
  auVar2 = vpinsrw_avx(auVar2,0x706,4);
  auVar2 = vpinsrw_avx(auVar2,0x706,5);
  auVar2 = vpinsrw_avx(auVar2,0x706,6);
  auVar2 = vpinsrw_avx(auVar2,0x706,7);
  auVar3 = vpinsrw_avx(ZEXT216(0x706),0x706,1);
  auVar3 = vpinsrw_avx(auVar3,0x706,2);
  auVar3 = vpinsrw_avx(auVar3,0x706,3);
  auVar3 = vpinsrw_avx(auVar3,0x706,4);
  auVar3 = vpinsrw_avx(auVar3,0x706,5);
  auVar3 = vpinsrw_avx(auVar3,0x706,6);
  auVar3 = vpinsrw_avx(auVar3,0x706,7);
  auVar26 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  uStack_390 = auVar26._0_8_;
  uStack_388 = auVar26._8_8_;
  auVar23._8_8_ = uStack_ed8;
  auVar23._0_8_ = local_ee0;
  auVar23._16_8_ = local_ee0;
  auVar23._24_8_ = uStack_ed8;
  auVar8._16_8_ = uStack_390;
  auVar8._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar8._24_8_ = uStack_388;
  auVar8 = vpshufb_avx2(auVar23,auVar8);
  auVar25 = ZEXT3264(filt_global_avx2._96_32_);
  local_fa8 = in_RDX;
  for (local_11e4 = in_R8D; auVar23 = auVar25._0_32_, 1 < local_11e4; local_11e4 = local_11e4 - 2) {
    yy_loadu2_128(in_stack_ffffffffffffed80._8_8_,in_stack_ffffffffffffed80._0_8_);
    auVar16[8] = '\x04';
    auVar16[9] = '\x05';
    auVar16[10] = '\x05';
    auVar16[0xb] = '\x06';
    auVar16[0xc] = '\x06';
    auVar16[0xd] = '\a';
    auVar16[0xe] = '\a';
    auVar16[0xf] = '\b';
    auVar16[0] = '\0';
    auVar16[1] = '\x01';
    auVar16[2] = '\x01';
    auVar16[3] = '\x02';
    auVar16[4] = '\x02';
    auVar16[5] = '\x03';
    auVar16[6] = '\x03';
    auVar16[7] = '\x04';
    auVar16[0x10] = '\0';
    auVar16[0x11] = '\x01';
    auVar16[0x12] = '\x01';
    auVar16[0x13] = '\x02';
    auVar16[0x14] = '\x02';
    auVar16[0x15] = '\x03';
    auVar16[0x16] = '\x03';
    auVar16[0x17] = '\x04';
    auVar16[0x18] = '\x04';
    auVar16[0x19] = '\x05';
    auVar16[0x1a] = '\x05';
    auVar16[0x1b] = '\x06';
    auVar16[0x1c] = '\x06';
    auVar16[0x1d] = '\a';
    auVar16[0x1e] = '\a';
    auVar16[0x1f] = '\b';
    auVar9 = vpshufb_avx2(auVar23,auVar16);
    auVar10 = vpshufb_avx2(auVar23,auVar21);
    auVar9 = vpmaddubsw_avx2(auVar9,auVar5);
    auVar10 = vpmaddubsw_avx2(auVar10,auVar8);
    auVar9 = vpaddsw_avx2(auVar9,auVar10);
    auVar15[8] = '\x06';
    auVar15[9] = '\a';
    auVar15[10] = '\a';
    auVar15[0xb] = '\b';
    auVar15[0xc] = '\b';
    auVar15[0xd] = '\t';
    auVar15[0xe] = '\t';
    auVar15[0xf] = '\n';
    auVar15[0] = '\x02';
    auVar15[1] = '\x03';
    auVar15[2] = '\x03';
    auVar15[3] = '\x04';
    auVar15[4] = '\x04';
    auVar15[5] = '\x05';
    auVar15[6] = '\x05';
    auVar15[7] = '\x06';
    auVar15[0x10] = '\x02';
    auVar15[0x11] = '\x03';
    auVar15[0x12] = '\x03';
    auVar15[0x13] = '\x04';
    auVar15[0x14] = '\x04';
    auVar15[0x15] = '\x05';
    auVar15[0x16] = '\x05';
    auVar15[0x17] = '\x06';
    auVar15[0x18] = '\x06';
    auVar15[0x19] = '\a';
    auVar15[0x1a] = '\a';
    auVar15[0x1b] = '\b';
    auVar15[0x1c] = '\b';
    auVar15[0x1d] = '\t';
    auVar15[0x1e] = '\t';
    auVar15[0x1f] = '\n';
    auVar10 = vpshufb_avx2(auVar23,auVar15);
    auVar14[8] = '\b';
    auVar14[9] = '\t';
    auVar14[10] = '\t';
    auVar14[0xb] = '\n';
    auVar14[0xc] = '\n';
    auVar14[0xd] = '\v';
    auVar14[0xe] = '\v';
    auVar14[0xf] = '\f';
    auVar14[0] = '\x04';
    auVar14[1] = '\x05';
    auVar14[2] = '\x05';
    auVar14[3] = '\x06';
    auVar14[4] = '\x06';
    auVar14[5] = '\a';
    auVar14[6] = '\a';
    auVar14[7] = '\b';
    auVar14[0x10] = '\x04';
    auVar14[0x11] = '\x05';
    auVar14[0x12] = '\x05';
    auVar14[0x13] = '\x06';
    auVar14[0x14] = '\x06';
    auVar14[0x15] = '\a';
    auVar14[0x16] = '\a';
    auVar14[0x17] = '\b';
    auVar14[0x18] = '\b';
    auVar14[0x19] = '\t';
    auVar14[0x1a] = '\t';
    auVar14[0x1b] = '\n';
    auVar14[0x1c] = '\n';
    auVar14[0x1d] = '\v';
    auVar14[0x1e] = '\v';
    auVar14[0x1f] = '\f';
    auVar24 = vpshufb_avx2(auVar23,auVar14);
    auVar23 = vpmaddubsw_avx2(auVar10,auVar6);
    auVar10 = vpmaddubsw_avx2(auVar24,auVar7);
    auVar23 = vpaddsw_avx2(auVar23,auVar10);
    auVar23 = vpaddsw_avx2(auVar9,auVar23);
    auVar24 = auVar23;
    yy_loadu2_128(in_stack_ffffffffffffed80._8_8_,in_stack_ffffffffffffed80._0_8_);
    auVar13[8] = '\x04';
    auVar13[9] = '\x05';
    auVar13[10] = '\x05';
    auVar13[0xb] = '\x06';
    auVar13[0xc] = '\x06';
    auVar13[0xd] = '\a';
    auVar13[0xe] = '\a';
    auVar13[0xf] = '\b';
    auVar13[0] = '\0';
    auVar13[1] = '\x01';
    auVar13[2] = '\x01';
    auVar13[3] = '\x02';
    auVar13[4] = '\x02';
    auVar13[5] = '\x03';
    auVar13[6] = '\x03';
    auVar13[7] = '\x04';
    auVar13[0x10] = '\0';
    auVar13[0x11] = '\x01';
    auVar13[0x12] = '\x01';
    auVar13[0x13] = '\x02';
    auVar13[0x14] = '\x02';
    auVar13[0x15] = '\x03';
    auVar13[0x16] = '\x03';
    auVar13[0x17] = '\x04';
    auVar13[0x18] = '\x04';
    auVar13[0x19] = '\x05';
    auVar13[0x1a] = '\x05';
    auVar13[0x1b] = '\x06';
    auVar13[0x1c] = '\x06';
    auVar13[0x1d] = '\a';
    auVar13[0x1e] = '\a';
    auVar13[0x1f] = '\b';
    auVar9 = vpshufb_avx2(auVar24,auVar13);
    auVar10 = vpshufb_avx2(auVar24,auVar21);
    auVar9 = vpmaddubsw_avx2(auVar9,auVar5);
    auVar10 = vpmaddubsw_avx2(auVar10,auVar8);
    auVar9 = vpaddsw_avx2(auVar9,auVar10);
    auVar12[8] = '\x06';
    auVar12[9] = '\a';
    auVar12[10] = '\a';
    auVar12[0xb] = '\b';
    auVar12[0xc] = '\b';
    auVar12[0xd] = '\t';
    auVar12[0xe] = '\t';
    auVar12[0xf] = '\n';
    auVar12[0] = '\x02';
    auVar12[1] = '\x03';
    auVar12[2] = '\x03';
    auVar12[3] = '\x04';
    auVar12[4] = '\x04';
    auVar12[5] = '\x05';
    auVar12[6] = '\x05';
    auVar12[7] = '\x06';
    auVar12[0x10] = '\x02';
    auVar12[0x11] = '\x03';
    auVar12[0x12] = '\x03';
    auVar12[0x13] = '\x04';
    auVar12[0x14] = '\x04';
    auVar12[0x15] = '\x05';
    auVar12[0x16] = '\x05';
    auVar12[0x17] = '\x06';
    auVar12[0x18] = '\x06';
    auVar12[0x19] = '\a';
    auVar12[0x1a] = '\a';
    auVar12[0x1b] = '\b';
    auVar12[0x1c] = '\b';
    auVar12[0x1d] = '\t';
    auVar12[0x1e] = '\t';
    auVar12[0x1f] = '\n';
    auVar10 = vpshufb_avx2(auVar24,auVar12);
    auVar11[8] = '\b';
    auVar11[9] = '\t';
    auVar11[10] = '\t';
    auVar11[0xb] = '\n';
    auVar11[0xc] = '\n';
    auVar11[0xd] = '\v';
    auVar11[0xe] = '\v';
    auVar11[0xf] = '\f';
    auVar11[0] = '\x04';
    auVar11[1] = '\x05';
    auVar11[2] = '\x05';
    auVar11[3] = '\x06';
    auVar11[4] = '\x06';
    auVar11[5] = '\a';
    auVar11[6] = '\a';
    auVar11[7] = '\b';
    auVar11[0x10] = '\x04';
    auVar11[0x11] = '\x05';
    auVar11[0x12] = '\x05';
    auVar11[0x13] = '\x06';
    auVar11[0x14] = '\x06';
    auVar11[0x15] = '\a';
    auVar11[0x16] = '\a';
    auVar11[0x17] = '\b';
    auVar11[0x18] = '\b';
    auVar11[0x19] = '\t';
    auVar11[0x1a] = '\t';
    auVar11[0x1b] = '\n';
    auVar11[0x1c] = '\n';
    auVar11[0x1d] = '\v';
    auVar11[0x1e] = '\v';
    auVar11[0x1f] = '\f';
    auVar24 = vpshufb_avx2(auVar24,auVar11);
    auVar10 = vpmaddubsw_avx2(auVar10,auVar6);
    auVar24 = vpmaddubsw_avx2(auVar24,auVar7);
    auVar10 = vpaddsw_avx2(auVar10,auVar24);
    auVar9 = vpaddsw_avx2(auVar9,auVar10);
    auVar18._16_8_ = uStack_490;
    auVar18._0_16_ = auVar1;
    auVar18._24_8_ = uStack_488;
    auVar23 = vpaddsw_avx2(auVar23,auVar18);
    auVar17._16_8_ = uStack_490;
    auVar17._0_16_ = auVar1;
    auVar17._24_8_ = uStack_488;
    auVar9 = vpaddsw_avx2(auVar9,auVar17);
    auVar23 = vpsraw_avx2(auVar23,ZEXT416(6));
    auVar9 = vpsraw_avx2(auVar9,ZEXT416(6));
    auVar23 = vpackuswb_avx2(auVar23,auVar9);
    local_f98 = (undefined1 (*) [16])(*local_f98 + in_RSI * 2);
    auVar25 = ZEXT1664(auVar23._0_16_);
    xx_store2_mi128((uint8_t *)CONCAT26(uVar27,in_stack_ffffffffffffed70),in_stack_ffffffffffffed68,
                    in_stack_ffffffffffffed60);
    local_fa8 = (undefined8 *)(in_RCX * 2 + (long)local_fa8);
  }
  if (local_11e4 != 0) {
    auVar2[8] = '\x04';
    auVar2[9] = '\x05';
    auVar2[10] = '\x05';
    auVar2[0xb] = '\x06';
    auVar2[0xc] = '\x06';
    auVar2[0xd] = '\a';
    auVar2[0xe] = '\a';
    auVar2[0xf] = '\b';
    auVar2[0] = '\0';
    auVar2[1] = '\x01';
    auVar2[2] = '\x01';
    auVar2[3] = '\x02';
    auVar2[4] = '\x02';
    auVar2[5] = '\x03';
    auVar2[6] = '\x03';
    auVar2[7] = '\x04';
    auVar2 = vpshufb_avx(*local_f98,auVar2);
    auVar3 = vpshufb_avx(*local_f98,auVar21._0_16_);
    auVar2 = vpmaddubsw_avx(auVar2,auVar5._0_16_);
    auVar3 = vpmaddubsw_avx(auVar3,auVar8._0_16_);
    auVar2 = vpaddsw_avx(auVar2,auVar3);
    auVar20[8] = '\x06';
    auVar20[9] = '\a';
    auVar20[10] = '\a';
    auVar20[0xb] = '\b';
    auVar20[0xc] = '\b';
    auVar20[0xd] = '\t';
    auVar20[0xe] = '\t';
    auVar20[0xf] = '\n';
    auVar20[0] = '\x02';
    auVar20[1] = '\x03';
    auVar20[2] = '\x03';
    auVar20[3] = '\x04';
    auVar20[4] = '\x04';
    auVar20[5] = '\x05';
    auVar20[6] = '\x05';
    auVar20[7] = '\x06';
    auVar3 = vpshufb_avx(*local_f98,auVar20);
    auVar19[8] = '\b';
    auVar19[9] = '\t';
    auVar19[10] = '\t';
    auVar19[0xb] = '\n';
    auVar19[0xc] = '\n';
    auVar19[0xd] = '\v';
    auVar19[0xe] = '\v';
    auVar19[0xf] = '\f';
    auVar19[0] = '\x04';
    auVar19[1] = '\x05';
    auVar19[2] = '\x05';
    auVar19[3] = '\x06';
    auVar19[4] = '\x06';
    auVar19[5] = '\a';
    auVar19[6] = '\a';
    auVar19[7] = '\b';
    auVar26 = vpshufb_avx(*local_f98,auVar19);
    auVar3 = vpmaddubsw_avx(auVar3,auVar6._0_16_);
    auVar26 = vpmaddubsw_avx(auVar26,auVar7._0_16_);
    auVar3 = vpaddsw_avx(auVar3,auVar26);
    auVar2 = vpaddsw_avx(auVar2,auVar3);
    pauVar22 = (undefined1 (*) [16])(*local_f98 + 8);
    auVar3[8] = '\x04';
    auVar3[9] = '\x05';
    auVar3[10] = '\x05';
    auVar3[0xb] = '\x06';
    auVar3[0xc] = '\x06';
    auVar3[0xd] = '\a';
    auVar3[0xe] = '\a';
    auVar3[0xf] = '\b';
    auVar3[0] = '\0';
    auVar3[1] = '\x01';
    auVar3[2] = '\x01';
    auVar3[3] = '\x02';
    auVar3[4] = '\x02';
    auVar3[5] = '\x03';
    auVar3[6] = '\x03';
    auVar3[7] = '\x04';
    auVar3 = vpshufb_avx(*pauVar22,auVar3);
    auVar26 = vpshufb_avx(*pauVar22,auVar21._0_16_);
    auVar3 = vpmaddubsw_avx(auVar3,auVar5._0_16_);
    auVar26 = vpmaddubsw_avx(auVar26,auVar8._0_16_);
    auVar3 = vpaddsw_avx(auVar3,auVar26);
    auVar26[8] = '\x06';
    auVar26[9] = '\a';
    auVar26[10] = '\a';
    auVar26[0xb] = '\b';
    auVar26[0xc] = '\b';
    auVar26[0xd] = '\t';
    auVar26[0xe] = '\t';
    auVar26[0xf] = '\n';
    auVar26[0] = '\x02';
    auVar26[1] = '\x03';
    auVar26[2] = '\x03';
    auVar26[3] = '\x04';
    auVar26[4] = '\x04';
    auVar26[5] = '\x05';
    auVar26[6] = '\x05';
    auVar26[7] = '\x06';
    auVar26 = vpshufb_avx(*pauVar22,auVar26);
    auVar4[8] = '\b';
    auVar4[9] = '\t';
    auVar4[10] = '\t';
    auVar4[0xb] = '\n';
    auVar4[0xc] = '\n';
    auVar4[0xd] = '\v';
    auVar4[0xe] = '\v';
    auVar4[0xf] = '\f';
    auVar4[0] = '\x04';
    auVar4[1] = '\x05';
    auVar4[2] = '\x05';
    auVar4[3] = '\x06';
    auVar4[4] = '\x06';
    auVar4[5] = '\a';
    auVar4[6] = '\a';
    auVar4[7] = '\b';
    auVar4 = vpshufb_avx(*pauVar22,auVar4);
    auVar26 = vpmaddubsw_avx(auVar26,auVar6._0_16_);
    auVar4 = vpmaddubsw_avx(auVar4,auVar7._0_16_);
    auVar26 = vpaddsw_avx(auVar26,auVar4);
    auVar3 = vpaddsw_avx(auVar3,auVar26);
    auVar2 = vpaddsw_avx(auVar2,auVar1);
    auVar2 = vpsraw_avx(auVar2,ZEXT416(6));
    auVar1 = vpaddsw_avx(auVar3,auVar1);
    auVar1 = vpsraw_avx(auVar1,ZEXT416(6));
    auVar1 = vpackuswb_avx(auVar2,auVar1);
    local_1250 = auVar1._0_8_;
    uStack_1248 = auVar1._8_8_;
    *local_fa8 = local_1250;
    local_fa8[1] = uStack_1248;
  }
  return;
}

Assistant:

static void aom_filter_block1d16_h8_avx2(
    const uint8_t *src_ptr, ptrdiff_t src_pixels_per_line, uint8_t *output_ptr,
    ptrdiff_t output_pitch, uint32_t output_height, const int16_t *filter) {
  __m128i filtersReg;
  __m256i addFilterReg32, filt1Reg, filt2Reg, filt3Reg, filt4Reg;
  __m256i firstFilters, secondFilters, thirdFilters, forthFilters;
  __m256i srcRegFilt32b1_1, srcRegFilt32b2_1, srcRegFilt32b2, srcRegFilt32b3;
  __m256i srcReg32b1, srcReg32b2, filtersReg32;
  unsigned int i;
  ptrdiff_t src_stride, dst_stride;
  src_ptr -= 3;
  addFilterReg32 = _mm256_set1_epi16(32);
  filtersReg = _mm_loadu_si128((const __m128i *)filter);
  filtersReg = _mm_srai_epi16(filtersReg, 1);
  // converting the 16 bit (short) to 8 bit (byte) and have the same data
  // in both lanes of 128 bit register.
  filtersReg = _mm_packs_epi16(filtersReg, filtersReg);
  // have the same data in both lanes of a 256 bit register
  filtersReg32 = MM256_BROADCASTSI128_SI256(filtersReg);

  // duplicate only the first 16 bits (first and second byte)
  // across 256 bit register
  firstFilters = _mm256_shuffle_epi8(filtersReg32, _mm256_set1_epi16(0x100u));
  // duplicate only the second 16 bits (third and forth byte)
  // across 256 bit register
  secondFilters = _mm256_shuffle_epi8(filtersReg32, _mm256_set1_epi16(0x302u));
  // duplicate only the third 16 bits (fifth and sixth byte)
  // across 256 bit register
  thirdFilters = _mm256_shuffle_epi8(filtersReg32, _mm256_set1_epi16(0x504u));
  // duplicate only the forth 16 bits (seventh and eighth byte)
  // across 256 bit register
  forthFilters = _mm256_shuffle_epi8(filtersReg32, _mm256_set1_epi16(0x706u));

  filt1Reg = _mm256_load_si256((__m256i const *)filt_global_avx2);
  filt2Reg = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32));
  filt3Reg = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 2));
  filt4Reg = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 3));

  // multiple the size of the source and destination stride by two
  src_stride = src_pixels_per_line << 1;
  dst_stride = output_pitch << 1;
  for (i = output_height; i > 1; i -= 2) {
    // load the 2 strides of source
    srcReg32b1 = yy_loadu2_128(src_ptr + src_pixels_per_line, src_ptr);

    // filter the source buffer
    srcRegFilt32b1_1 = _mm256_shuffle_epi8(srcReg32b1, filt1Reg);
    srcRegFilt32b2 = _mm256_shuffle_epi8(srcReg32b1, filt4Reg);

    // multiply 2 adjacent elements with the filter and add the result
    srcRegFilt32b1_1 = _mm256_maddubs_epi16(srcRegFilt32b1_1, firstFilters);
    srcRegFilt32b2 = _mm256_maddubs_epi16(srcRegFilt32b2, forthFilters);

    // add and saturate the results together
    srcRegFilt32b1_1 = _mm256_adds_epi16(srcRegFilt32b1_1, srcRegFilt32b2);

    // filter the source buffer
    srcRegFilt32b3 = _mm256_shuffle_epi8(srcReg32b1, filt2Reg);
    srcRegFilt32b2 = _mm256_shuffle_epi8(srcReg32b1, filt3Reg);

    // multiply 2 adjacent elements with the filter and add the result
    srcRegFilt32b3 = _mm256_maddubs_epi16(srcRegFilt32b3, secondFilters);
    srcRegFilt32b2 = _mm256_maddubs_epi16(srcRegFilt32b2, thirdFilters);

    __m256i sum23 = _mm256_adds_epi16(srcRegFilt32b3, srcRegFilt32b2);
    srcRegFilt32b1_1 = _mm256_adds_epi16(srcRegFilt32b1_1, sum23);

    // reading 2 strides of the next 16 bytes
    // (part of it was being read by earlier read)
    srcReg32b2 = yy_loadu2_128(src_ptr + src_pixels_per_line + 8, src_ptr + 8);

    // filter the source buffer
    srcRegFilt32b2_1 = _mm256_shuffle_epi8(srcReg32b2, filt1Reg);
    srcRegFilt32b2 = _mm256_shuffle_epi8(srcReg32b2, filt4Reg);

    // multiply 2 adjacent elements with the filter and add the result
    srcRegFilt32b2_1 = _mm256_maddubs_epi16(srcRegFilt32b2_1, firstFilters);
    srcRegFilt32b2 = _mm256_maddubs_epi16(srcRegFilt32b2, forthFilters);

    // add and saturate the results together
    srcRegFilt32b2_1 = _mm256_adds_epi16(srcRegFilt32b2_1, srcRegFilt32b2);

    // filter the source buffer
    srcRegFilt32b3 = _mm256_shuffle_epi8(srcReg32b2, filt2Reg);
    srcRegFilt32b2 = _mm256_shuffle_epi8(srcReg32b2, filt3Reg);

    // multiply 2 adjacent elements with the filter and add the result
    srcRegFilt32b3 = _mm256_maddubs_epi16(srcRegFilt32b3, secondFilters);
    srcRegFilt32b2 = _mm256_maddubs_epi16(srcRegFilt32b2, thirdFilters);

    // add and saturate the results together
    srcRegFilt32b2_1 = _mm256_adds_epi16(
        srcRegFilt32b2_1, _mm256_adds_epi16(srcRegFilt32b3, srcRegFilt32b2));

    // shift by 6 bit each 16 bit
    srcRegFilt32b1_1 = _mm256_adds_epi16(srcRegFilt32b1_1, addFilterReg32);
    srcRegFilt32b2_1 = _mm256_adds_epi16(srcRegFilt32b2_1, addFilterReg32);
    srcRegFilt32b1_1 = _mm256_srai_epi16(srcRegFilt32b1_1, 6);
    srcRegFilt32b2_1 = _mm256_srai_epi16(srcRegFilt32b2_1, 6);

    // shrink to 8 bit each 16 bits, the first lane contain the first
    // convolve result and the second lane contain the second convolve result
    srcRegFilt32b1_1 = _mm256_packus_epi16(srcRegFilt32b1_1, srcRegFilt32b2_1);

    src_ptr += src_stride;

    xx_store2_mi128(output_ptr, output_pitch, &srcRegFilt32b1_1);
    output_ptr += dst_stride;
  }

  // if the number of strides is odd.
  // process only 16 bytes
  if (i > 0) {
    __m128i srcReg1, srcReg2, srcRegFilt1_1, srcRegFilt2_1;
    __m128i srcRegFilt2, srcRegFilt3;

    srcReg1 = _mm_loadu_si128((const __m128i *)(src_ptr));

    // filter the source buffer
    srcRegFilt1_1 = _mm_shuffle_epi8(srcReg1, _mm256_castsi256_si128(filt1Reg));
    srcRegFilt2 = _mm_shuffle_epi8(srcReg1, _mm256_castsi256_si128(filt4Reg));

    // multiply 2 adjacent elements with the filter and add the result
    srcRegFilt1_1 =
        _mm_maddubs_epi16(srcRegFilt1_1, _mm256_castsi256_si128(firstFilters));
    srcRegFilt2 =
        _mm_maddubs_epi16(srcRegFilt2, _mm256_castsi256_si128(forthFilters));

    // add and saturate the results together
    srcRegFilt1_1 = _mm_adds_epi16(srcRegFilt1_1, srcRegFilt2);

    // filter the source buffer
    srcRegFilt3 = _mm_shuffle_epi8(srcReg1, _mm256_castsi256_si128(filt2Reg));
    srcRegFilt2 = _mm_shuffle_epi8(srcReg1, _mm256_castsi256_si128(filt3Reg));

    // multiply 2 adjacent elements with the filter and add the result
    srcRegFilt3 =
        _mm_maddubs_epi16(srcRegFilt3, _mm256_castsi256_si128(secondFilters));
    srcRegFilt2 =
        _mm_maddubs_epi16(srcRegFilt2, _mm256_castsi256_si128(thirdFilters));

    // add and saturate the results together
    srcRegFilt1_1 =
        _mm_adds_epi16(srcRegFilt1_1, _mm_adds_epi16(srcRegFilt3, srcRegFilt2));

    // reading the next 16 bytes
    // (part of it was being read by earlier read)
    srcReg2 = _mm_loadu_si128((const __m128i *)(src_ptr + 8));

    // filter the source buffer
    srcRegFilt2_1 = _mm_shuffle_epi8(srcReg2, _mm256_castsi256_si128(filt1Reg));
    srcRegFilt2 = _mm_shuffle_epi8(srcReg2, _mm256_castsi256_si128(filt4Reg));

    // multiply 2 adjacent elements with the filter and add the result
    srcRegFilt2_1 =
        _mm_maddubs_epi16(srcRegFilt2_1, _mm256_castsi256_si128(firstFilters));
    srcRegFilt2 =
        _mm_maddubs_epi16(srcRegFilt2, _mm256_castsi256_si128(forthFilters));

    // add and saturate the results together
    srcRegFilt2_1 = _mm_adds_epi16(srcRegFilt2_1, srcRegFilt2);

    // filter the source buffer
    srcRegFilt3 = _mm_shuffle_epi8(srcReg2, _mm256_castsi256_si128(filt2Reg));
    srcRegFilt2 = _mm_shuffle_epi8(srcReg2, _mm256_castsi256_si128(filt3Reg));

    // multiply 2 adjacent elements with the filter and add the result
    srcRegFilt3 =
        _mm_maddubs_epi16(srcRegFilt3, _mm256_castsi256_si128(secondFilters));
    srcRegFilt2 =
        _mm_maddubs_epi16(srcRegFilt2, _mm256_castsi256_si128(thirdFilters));

    // add and saturate the results together
    srcRegFilt2_1 =
        _mm_adds_epi16(srcRegFilt2_1, _mm_adds_epi16(srcRegFilt3, srcRegFilt2));

    // shift by 6 bit each 16 bit
    srcRegFilt1_1 =
        _mm_adds_epi16(srcRegFilt1_1, _mm256_castsi256_si128(addFilterReg32));
    srcRegFilt1_1 = _mm_srai_epi16(srcRegFilt1_1, 6);

    srcRegFilt2_1 =
        _mm_adds_epi16(srcRegFilt2_1, _mm256_castsi256_si128(addFilterReg32));
    srcRegFilt2_1 = _mm_srai_epi16(srcRegFilt2_1, 6);

    // shrink to 8 bit each 16 bits, the first lane contain the first
    // convolve result and the second lane contain the second convolve
    // result
    srcRegFilt1_1 = _mm_packus_epi16(srcRegFilt1_1, srcRegFilt2_1);

    // save 16 bytes
    _mm_store_si128((__m128i *)output_ptr, srcRegFilt1_1);
  }
}